

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O1

vector<libtorrent::open_file_state,_std::allocator<libtorrent::open_file_state>_> * __thiscall
libtorrent::torrent_handle::file_status
          (vector<libtorrent::open_file_state,_std::allocator<libtorrent::open_file_state>_>
           *__return_storage_ptr__,torrent_handle *this)

{
  int iVar1;
  element_type *peVar2;
  _func_int **pp_Var3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar5;
  
  this_00 = (this->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = this_00->_M_use_count;
    do {
      if (iVar4 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar5 = iVar4 == iVar1;
      if (bVar5) {
        this_00->_M_use_count = iVar4 + 1;
        iVar1 = iVar4;
      }
      iVar4 = iVar1;
      UNLOCK();
    } while (!bVar5);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = this_00->_M_use_count == 0;
  }
  peVar2 = (this->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (((bool)(peVar2 == (element_type *)0x0 | bVar5)) ||
     ((peVar2->m_storage).m_disk_io == (disk_interface *)0x0)) {
    (__return_storage_ptr__->
    super__Vector_base<libtorrent::open_file_state,_std::allocator<libtorrent::open_file_state>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<libtorrent::open_file_state,_std::allocator<libtorrent::open_file_state>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<libtorrent::open_file_state,_std::allocator<libtorrent::open_file_state>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pp_Var3 = (peVar2->super_torrent_hot_members).m_ses[0x22d].super_session_logger.
              _vptr_session_logger;
    (**(code **)(*pp_Var3 + 0x78))(__return_storage_ptr__,pp_Var3,(peVar2->m_storage).m_idx.m_val);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<open_file_state> torrent_handle::file_status() const
	{
		auto t = m_torrent.lock();
		if (!t || !t->has_storage()) return {};
		auto& ses = static_cast<session_impl&>(t->session());
		return ses.disk_thread().get_status(t->storage());
	}